

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O2

void initial_load_test_tailing_null(void)

{
  uint32_t uVar1;
  hbtrie_result hVar2;
  int iVar3;
  filemgr_ops *ops;
  filemgr *file;
  bid_t bVar4;
  list_elem *plVar5;
  list_elem *plVar6;
  btree_blk_ops *btree_blk_ops;
  initial_load_elem *ile;
  ulong uVar7;
  char *__format;
  list_elem *__size;
  long lVar8;
  bool bVar9;
  filemgr_open_result fVar10;
  docio_object local_828;
  list entries;
  uint8_t valuebuf [8];
  docio_handle dhandle;
  timeval __test_begin;
  btreeblk_handle bhandle;
  hbtrie trie;
  char local_698 [256];
  filemgr_config local_598;
  char body [256];
  char meta [256];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  local_828.timestamp = 0;
  local_828._20_4_ = 0;
  local_828.length.keylen = 0;
  local_828.length.metalen = 0;
  local_828.length.bodylen = 0;
  local_828.length.bodylen_ondisk = 0;
  local_828.length.flag = '\0';
  local_828.length.checksum = '\0';
  local_828.length.reserved = 0;
  local_828.field_3.seqnum = 0;
  local_828.key = keybuf;
  local_828.meta = metabuf;
  local_828.body = bodybuf;
  local_598.prefetch_duration = 0;
  local_598.encryption_key.bytes[0] = '\0';
  local_598.encryption_key.bytes[1] = '\0';
  local_598.encryption_key.bytes[2] = '\0';
  local_598.encryption_key.bytes[3] = '\0';
  local_598.encryption_key.bytes[4] = '\0';
  local_598.encryption_key.bytes[5] = '\0';
  local_598.encryption_key.bytes[6] = '\0';
  local_598.encryption_key.bytes[7] = '\0';
  local_598.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_598.do_not_cache_doc_blocks = false;
  local_598._89_3_ = 0;
  local_598.num_blocks_readahead = 0;
  local_598.encryption_key.bytes[0x18] = '\0';
  local_598.encryption_key.bytes[0x19] = '\0';
  local_598.encryption_key.bytes[0x1a] = '\0';
  local_598.encryption_key.bytes[0x1b] = '\0';
  local_598.encryption_key.bytes[0x1c] = '\0';
  local_598.encryption_key.bytes[0x1d] = '\0';
  local_598.encryption_key.bytes[0x1e] = '\0';
  local_598.encryption_key.bytes[0x1f] = '\0';
  local_598.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_598.encryption_key.bytes[8] = '\0';
  local_598.encryption_key.bytes[9] = '\0';
  local_598.encryption_key.bytes[10] = '\0';
  local_598.encryption_key.bytes[0xb] = '\0';
  local_598.encryption_key.bytes[0xc] = '\0';
  local_598.encryption_key.bytes[0xd] = '\0';
  local_598.encryption_key.bytes[0xe] = '\0';
  local_598.encryption_key.bytes[0xf] = '\0';
  local_598.encryption_key.bytes[0x10] = '\0';
  local_598.encryption_key.bytes[0x11] = '\0';
  local_598.encryption_key.bytes[0x12] = '\0';
  local_598.encryption_key.bytes[0x13] = '\0';
  local_598.encryption_key.bytes[0x14] = '\0';
  local_598.encryption_key.bytes[0x15] = '\0';
  local_598.encryption_key.bytes[0x16] = '\0';
  local_598.encryption_key.bytes[0x17] = '\0';
  local_598.blocksize = 0x1000;
  local_598.ncacheblock = 0;
  local_598.flag = 0;
  local_598.chunksize = 8;
  local_598.options = '\b';
  local_598.seqtree_opt = '\0';
  local_598._18_6_ = 0;
  local_598.num_wal_shards = 8;
  local_598.num_bcache_shards = 0;
  local_598.encryption_key.algorithm = 0;
  ops = get_filemgr_ops();
  fVar10 = filemgr_open("./hbtrie_testfile",ops,&local_598,(err_log_callback *)0x0);
  file = fVar10.file;
  docio_init(&dhandle,file,false);
  btreeblk_init(&bhandle,file,0x1000);
  memset(local_698 + 9,0,0xf7);
  builtin_strncpy(local_698,"00000000",9);
  entries.head = (list_elem *)0x0;
  entries.tail = (list_elem *)0x0;
  lVar8 = 8;
  uVar7 = 0;
  while( true ) {
    bVar9 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar9) {
      btree_blk_ops = btreeblk_get_ops();
      hbtrie_init_and_load
                (&trie,8,8,0x1000,0xffffffffffffffff,&bhandle,btree_blk_ops,&dhandle,_readkey_wrap,8
                 ,initial_load_next,initial_load_get,initial_btreeblk_end,&entries);
      filemgr_commit(file,true,(err_log_callback *)0x0);
      printf("trie root bid %lu\n",trie.root_bid);
      lVar8 = 0;
      while( true ) {
        if (lVar8 == 8) {
          hbtrie_free(&trie);
          docio_free(&dhandle);
          btreeblk_free(&bhandle);
          filemgr_close(file,true,(char *)0x0,(err_log_callback *)0x0);
          filemgr_shutdown();
          plVar5 = entries.head;
          while (plVar5 != (list_elem *)0x0) {
            plVar6 = plVar5->next;
            free(plVar5[1].prev);
            free(plVar5);
            plVar5 = plVar6;
          }
          __format = "%s PASSED\n";
          if (initial_load_test_tailing_null()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"initial load with tailing null test");
          return;
        }
        sprintf(meta,"metadata_%03zu",lVar8);
        sprintf(body,"body_%03zu",lVar8);
        hVar2 = hbtrie_find(&trie,local_698,(int)lVar8 + 8,valuebuf);
        btreeblk_end(&bhandle);
        if (hVar2 == HBTRIE_RESULT_FAIL) break;
        docio_read_doc(&dhandle,(ulong)valuebuf >> 0x38 |
                                ((ulong)valuebuf & 0xff000000000000) >> 0x28 |
                                ((ulong)valuebuf & 0xff0000000000) >> 0x18 |
                                ((ulong)valuebuf & 0xff00000000) >> 8 |
                                ((ulong)valuebuf & 0xff000000) << 8 |
                                ((ulong)valuebuf & 0xff0000) << 0x18 |
                                ((ulong)valuebuf & 0xff00) << 0x28 | (long)valuebuf << 0x38,
                       &local_828,true);
        iVar3 = bcmp(local_828.key,local_698,local_828.length._0_8_ & 0xffff);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                 );
          initial_load_test_tailing_null()::__test_pass = '\x01';
          iVar3 = bcmp(local_828.key,local_698,local_828.length._0_8_ & 0xffff);
          if (iVar3 != 0) {
            __assert_fail("!memcmp(doc.key, dockey, doc.length.keylen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x54c,"void initial_load_test_tailing_null()");
          }
        }
        iVar3 = bcmp(local_828.meta,meta,(ulong)local_828.length._0_8_ >> 0x10 & 0xffff);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                 );
          initial_load_test_tailing_null()::__test_pass = '\x01';
          iVar3 = bcmp(local_828.meta,meta,(ulong)local_828.length._0_8_ >> 0x10 & 0xffff);
          if (iVar3 != 0) {
            __assert_fail("!memcmp(doc.meta, meta, doc.length.metalen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x54d,"void initial_load_test_tailing_null()");
          }
        }
        iVar3 = bcmp(local_828.body,body,(ulong)local_828.length._0_8_ >> 0x20);
        if (iVar3 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                 );
          initial_load_test_tailing_null()::__test_pass = '\x01';
          iVar3 = bcmp(local_828.body,body,(ulong)local_828.length._0_8_ >> 0x20);
          if (iVar3 != 0) {
            __assert_fail("!memcmp(doc.body, body, doc.length.bodylen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x54e,"void initial_load_test_tailing_null()");
          }
        }
        lVar8 = lVar8 + 1;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
              ,0x545);
      initial_load_test_tailing_null()::__test_pass = 1;
      __assert_fail("r != HBTRIE_RESULT_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x545,"void initial_load_test_tailing_null()");
    }
    sprintf(meta,"metadata_%03zu",uVar7);
    sprintf(body,"body_%03zu",uVar7);
    uVar1 = _set_doc_bin(&local_828,local_698,uVar7 | 8,meta,body);
    if (uVar1 == 0) break;
    bVar4 = docio_append_doc(&dhandle,&local_828,'\0','\0');
    plVar5 = (list_elem *)malloc(0x28);
    __size = (list_elem *)(local_828.length._0_8_ & 0xffff);
    plVar5[1].next = __size;
    plVar6 = (list_elem *)malloc((size_t)__size);
    plVar5[1].prev = plVar6;
    memcpy(plVar6,local_698,(size_t)__size);
    plVar5[2].prev =
         (list_elem *)
         (bVar4 >> 0x38 | (bVar4 & 0xff000000000000) >> 0x28 | (bVar4 & 0xff0000000000) >> 0x18 |
          (bVar4 & 0xff00000000) >> 8 | (bVar4 & 0xff000000) << 8 | (bVar4 & 0xff0000) << 0x18 |
          (bVar4 & 0xff00) << 0x28 | bVar4 << 0x38);
    list_push_back(&entries,plVar5);
    uVar7 = uVar7 + 1;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
          ,0x526);
  initial_load_test_tailing_null()::__test_pass = 1;
  __assert_fail("docsize != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x526,"void initial_load_test_tailing_null()");
}

Assistant:

void initial_load_test_tailing_null()
{
    TEST_INIT();

    int blocksize = 4096;
    uint64_t offset, _offset;
    uint32_t docsize;
    char dockey[256], meta[256], body[256];
    hbtrie_result r;

    int rr = system(SHELL_DEL " hbtrie_testfile");
    (void)rr;

    char keybuf[256], metabuf[256], bodybuf[256];
    struct docio_object doc;
    memset(&doc, 0, sizeof(struct docio_object));
    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    struct filemgr_config config;
    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    struct filemgr *file = result.file;
    struct docio_handle dhandle;
    docio_init(&dhandle, file, false);

    struct btreeblk_handle bhandle;
    btreeblk_init(&bhandle, file, blocksize);

    memset(dockey, 0x0, 256);
    sprintf(dockey, "00000000");

    struct list entries;
    list_init(&entries);
    for (size_t ii = 0; ii < 8; ++ii) {
        sprintf(meta, "metadata_%03zu", ii);
        sprintf(body, "body_%03zu", ii);
        docsize = _set_doc_bin(&doc, dockey, 8 + ii, meta, body);
        TEST_CHK(docsize != 0);
        offset = docio_append_doc(&dhandle, &doc, 0, 0);
        _offset = _endian_encode(offset);

        struct initial_load_elem* ile =
            (struct initial_load_elem*)malloc(sizeof(struct initial_load_elem));
        ile->keylen = doc.length.keylen;
        ile->key = (uint8_t*)malloc(ile->keylen);
        memcpy(ile->key, dockey, ile->keylen);
        memcpy(ile->value, &_offset, sizeof(_offset));
        list_push_back(&entries, &ile->le);
    }

    struct hbtrie trie;
    hbtrie_init_and_load(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
                         (void*)&bhandle, btreeblk_get_ops(),
                         (void*)&dhandle, _readkey_wrap,
                         8,
                         initial_load_next, initial_load_get, initial_btreeblk_end,
                         &entries);

    filemgr_commit(file, true, NULL);
    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    for (size_t ii = 0; ii < 8; ++ii) {
        sprintf(meta, "metadata_%03zu", ii);
        sprintf(body, "body_%03zu", ii);

        uint8_t valuebuf[8];
        r = hbtrie_find(&trie, (void*)dockey, 8 + ii, (void*)valuebuf);
        btreeblk_end(&bhandle);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);

        if (r != HBTRIE_RESULT_FAIL) {
            memcpy(&_offset, valuebuf, 8);
            _offset = _endian_decode(_offset);
            docio_read_doc(&dhandle, _offset, &doc, true);

            TEST_CHK(!memcmp(doc.key, dockey, doc.length.keylen));
            TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
            TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));
        }
    }

    hbtrie_free(&trie);
    docio_free(&dhandle);
    btreeblk_free(&bhandle);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    struct list_elem* le = list_begin(&entries);
    while (le) {
        struct initial_load_elem* ile =
            _get_entry(le, struct initial_load_elem, le);
        le = list_next(le);
        free(ile->key);
        free(ile);
    }

    TEST_RESULT("initial load with tailing null test");
}